

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalNinjaGenerator::AddCustomCommandTarget
          (cmLocalNinjaGenerator *this,cmCustomCommand *cc,cmGeneratorTarget *target)

{
  pair<std::_Rb_tree_iterator<std::pair<const_cmCustomCommand_*const,_std::set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>_>_>,_bool>
  pVar1;
  value_type v;
  cmGeneratorTarget *local_90;
  cmCustomCommand *local_88;
  pair<const_cmCustomCommand_*const,_std::set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>_>
  local_80;
  _Rb_tree<cmGeneratorTarget_*,_cmGeneratorTarget_*,_std::_Identity<cmGeneratorTarget_*>,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
  local_48;
  
  local_48._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_48._M_impl.super__Rb_tree_header._M_header;
  local_48._M_impl._0_8_ = 0;
  local_48._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_48._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_48._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_48._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90 = target;
  local_88 = cc;
  local_80.first = cc;
  local_48._M_impl.super__Rb_tree_header._M_header._M_right =
       local_48._M_impl.super__Rb_tree_header._M_header._M_left;
  std::_Rb_tree_header::_Rb_tree_header
            (&local_80.second._M_t._M_impl.super__Rb_tree_header,
             (_Rb_tree_header *)local_48._M_impl.super__Rb_tree_header._M_header._M_left);
  std::
  _Rb_tree<cmGeneratorTarget_*,_cmGeneratorTarget_*,_std::_Identity<cmGeneratorTarget_*>,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
  ::~_Rb_tree(&local_48);
  pVar1 = std::
          _Rb_tree<cmCustomCommand_const*,std::pair<cmCustomCommand_const*const,std::set<cmGeneratorTarget*,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>>,std::_Select1st<std::pair<cmCustomCommand_const*const,std::set<cmGeneratorTarget*,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>>>,std::less<cmCustomCommand_const*>,std::allocator<std::pair<cmCustomCommand_const*const,std::set<cmGeneratorTarget*,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>>>>
          ::
          _M_emplace_unique<std::pair<cmCustomCommand_const*const,std::set<cmGeneratorTarget*,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>>&>
                    ((_Rb_tree<cmCustomCommand_const*,std::pair<cmCustomCommand_const*const,std::set<cmGeneratorTarget*,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>>,std::_Select1st<std::pair<cmCustomCommand_const*const,std::set<cmGeneratorTarget*,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>>>,std::less<cmCustomCommand_const*>,std::allocator<std::pair<cmCustomCommand_const*const,std::set<cmGeneratorTarget*,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>>>>
                      *)&this->CustomCommandTargets,&local_80);
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    std::vector<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>::push_back
              (&this->CustomCommands,&local_88);
  }
  std::
  _Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
  ::_M_insert_unique<cmGeneratorTarget*const&>
            ((_Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
              *)&pVar1.first._M_node._M_node[1]._M_parent,&local_90);
  std::
  _Rb_tree<cmGeneratorTarget_*,_cmGeneratorTarget_*,_std::_Identity<cmGeneratorTarget_*>,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
  ::~_Rb_tree(&local_80.second._M_t);
  return;
}

Assistant:

void cmLocalNinjaGenerator::AddCustomCommandTarget(cmCustomCommand const* cc,
                                                   cmGeneratorTarget* target)
{
  CustomCommandTargetMap::value_type v(cc, std::set<cmGeneratorTarget*>());
  std::pair<CustomCommandTargetMap::iterator, bool> ins =
    this->CustomCommandTargets.insert(v);
  if (ins.second) {
    this->CustomCommands.push_back(cc);
  }
  ins.first->second.insert(target);
}